

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O0

void ns_write_to_socket(ns_connection *conn)

{
  int iVar1;
  ssize_t sVar2;
  int local_1c;
  iobuf *piStack_18;
  int n;
  iobuf *io;
  ns_connection *conn_local;
  
  piStack_18 = &conn->send_iobuf;
  local_1c = 0;
  io = (iobuf *)conn;
  sVar2 = send(conn->sock,piStack_18->buf,(conn->send_iobuf).len,0);
  local_1c = (int)sVar2;
  ns_call((ns_connection *)io,4,&local_1c);
  iVar1 = ns_is_error(local_1c);
  if (iVar1 == 0) {
    if (0 < local_1c) {
      iobuf_remove(piStack_18,(long)local_1c);
    }
  }
  else {
    *(uint *)&io[6].len = (uint)io[6].len | 0x10;
  }
  return;
}

Assistant:

static void ns_write_to_socket(struct ns_connection *conn) {
  struct iobuf *io = &conn->send_iobuf;
  int n = 0;

#ifdef NS_ENABLE_SSL
  if (conn->ssl != NULL) {
    n = SSL_write(conn->ssl, io->buf, io->len);
    if (n <= 0) {
      int ssl_err = ns_ssl_err(conn, n);
      if (ssl_err == SSL_ERROR_WANT_READ || ssl_err == SSL_ERROR_WANT_WRITE) {
        return; // Call us again
      } else {
        conn->flags |= NSF_CLOSE_IMMEDIATELY;
      }
    }
  } else
#endif
  { n = (int) send(conn->sock, io->buf, io->len, 0); }

  DBG(("%p %d -> %d bytes", conn, conn->flags, n));

  ns_call(conn, NS_SEND, &n);
  if (ns_is_error(n)) {
    conn->flags |= NSF_CLOSE_IMMEDIATELY;
  } else if (n > 0) {
    iobuf_remove(io, n);
  }
}